

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

ExecutionQueue *
llbuild::basic::createLaneBasedExecutionQueue
          (ExecutionQueueDelegate *delegate,int numLanes,SchedulerAlgorithm alg,QualityOfService qos
          ,char **environment)

{
  type tVar1;
  undefined4 uVar2;
  uint uVar3;
  ExecutionQueue *this;
  FifoScheduler *this_00;
  llbuild_rlim_t lVar4;
  char *pcVar5;
  uint uVar6;
  llbuild_rlim_t lVar7;
  uint i;
  int iVar8;
  uint local_13c4;
  ExecutionQueueDelegate *local_13c0;
  anon_union_5000_2_650ea050_for_random_device_0 local_13b8;
  
  if (environment == (char **)0x0) {
    environment = (char **)_environ;
  }
  local_13c0 = (ExecutionQueueDelegate *)environment;
  this = (ExecutionQueue *)operator_new(0x230);
  ExecutionQueue::ExecutionQueue(this,delegate);
  this->_vptr_ExecutionQueue = (_func_int **)&PTR__LaneBasedExecutionQueue_00203a68;
  std::random_device::random_device((random_device *)&local_13b8.field_0);
  uVar2 = std::random_device::_M_getval();
  std::random_device::_M_fini();
  *(undefined4 *)&this[1]._vptr_ExecutionQueue = uVar2;
  this[2].delegate = (ExecutionQueueDelegate *)0x0;
  this[1].delegate = (ExecutionQueueDelegate *)0x0;
  this[2]._vptr_ExecutionQueue = (_func_int **)0x0;
  *(QualityOfService *)&this[3]._vptr_ExecutionQueue = qos;
  if (alg == FIFO) {
    this_00 = (FifoScheduler *)operator_new(0x58);
    anon_unknown.dwarf_2d1e6d::FifoScheduler::FifoScheduler(this_00);
  }
  else {
    if (alg != NamePriority) {
      __assert_fail("0 && \"unknown scheduler algorithm\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Basic/LaneBasedExecutionQueue.cpp"
                    ,0x1df,
                    "static std::unique_ptr<Scheduler> (anonymous namespace)::Scheduler::make(SchedulerAlgorithm)"
                   );
    }
    this_00 = (FifoScheduler *)operator_new(0x28);
    ((ProcessDelegate *)&this_00->super_Scheduler)->_vptr_ProcessDelegate =
         (_func_int **)&PTR__PriorityQueueScheduler_00203aa0;
    (this_00->jobs).
    super__Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (this_00->jobs).
    super__Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    (this_00->jobs).
    super__Deque_base<llbuild::basic::QueueJob,_std::allocator<llbuild::basic::QueueJob>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  }
  this[3].delegate = (ExecutionQueueDelegate *)this_00;
  anon_unknown.dwarf_2d1e6d::FifoScheduler::FifoScheduler((FifoScheduler *)(this + 4));
  this[10].delegate = (ExecutionQueueDelegate *)0x0;
  this[0xb]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[9].delegate = (ExecutionQueueDelegate *)0x0;
  this[10]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0xb].delegate = (ExecutionQueueDelegate *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0xc));
  *(undefined2 *)&this[0xf]._vptr_ExecutionQueue = 0;
  ProcessGroup::ProcessGroup((ProcessGroup *)&this[0xf].delegate);
  this[0x1b]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1b].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x1a]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1a].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x19]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x19].delegate = (ExecutionQueueDelegate *)0x0;
  std::condition_variable::condition_variable((condition_variable *)(this + 0x1c));
  *(undefined8 *)((long)&this[0x21].delegate + 4) = 0;
  this[0x1f]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x1f].delegate = (ExecutionQueueDelegate *)0x0;
  this[0x20]._vptr_ExecutionQueue = (_func_int **)0x0;
  this[0x20].delegate = (ExecutionQueueDelegate *)0x0;
  *(undefined8 *)((long)&this[0x20].delegate + 1) = 0;
  *(undefined8 *)((long)&this[0x21]._vptr_ExecutionQueue + 1) = 0;
  this[0x22].delegate = local_13c0;
  lVar4 = sys::getOpenFileLimit();
  iVar8 = 0;
  if (lVar4 < 10) {
    numLanes = 1;
  }
  else {
    lVar7 = 0x7fffffff;
    if (lVar4 < 0x7fffffff) {
      lVar7 = lVar4;
    }
    uVar6 = (int)lVar7 - 10U >> 1;
    if ((uint)numLanes <= uVar6) {
      local_13c4 = 0;
      pcVar5 = getenv("LLBUILD_BACKGROUND_TASK_MAX");
      if (pcVar5 == (char *)0x0) {
LAB_0015a270:
        uVar3 = numLanes << 6;
        if (0x3ff < (uint)(numLanes << 6)) {
          uVar3 = 0x400;
        }
      }
      else {
        local_13b8.field_0._M_file = pcVar5;
        local_13b8.field_0._M_func = (_func_result_type_void_ptr *)strlen(pcVar5);
        tVar1 = llvm::StringRef::getAsInteger<unsigned_int>
                          ((StringRef *)&local_13b8.field_0,10,&local_13c4);
        uVar3 = local_13c4;
        if (tVar1) goto LAB_0015a270;
      }
      if (uVar6 - numLanes < uVar3) {
        uVar3 = uVar6 - numLanes;
      }
      goto LAB_0015a28c;
    }
    numLanes = uVar6 + (uVar6 == 0);
  }
  uVar3 = 0;
LAB_0015a28c:
  *(int *)((long)&this[1]._vptr_ExecutionQueue + 4) = numLanes;
  *(uint *)((long)&this[0x21].delegate + 4) = uVar3;
  for (; iVar8 != numLanes; iVar8 = iVar8 + 1) {
    pcVar5 = (char *)operator_new(8);
    pcVar5[0] = '\0';
    pcVar5[1] = '\0';
    pcVar5[2] = '\0';
    pcVar5[3] = '\0';
    pcVar5[4] = '\0';
    pcVar5[5] = '\0';
    pcVar5[6] = '\0';
    pcVar5[7] = '\0';
    local_13b8.field_0._M_file = operator_new(0x28);
    *(undefined ***)local_13b8.field_0._M_file = &PTR___State_00203b48;
    *(int *)((long)local_13b8.field_0._M_file + 8) = iVar8;
    *(undefined4 *)((long)local_13b8.field_0._M_file + 0xc) =
         *(undefined4 *)&this[1]._vptr_ExecutionQueue;
    *(ExecutionQueue **)((long)local_13b8.field_0._M_file + 0x10) = this;
    *(code **)((long)local_13b8.field_0._M_file + 0x18) =
         anon_unknown.dwarf_2d1e6d::LaneBasedExecutionQueue::executeLane;
    *(long *)((long)local_13b8.field_0._M_file + 0x20) = 0;
    std::thread::_M_start_thread(pcVar5,&local_13b8,0);
    if ((long *)local_13b8.field_0._M_file != (long *)0x0) {
      (**(code **)(*local_13b8.field_0._M_file + 8))();
    }
    local_13b8.field_0._M_file = pcVar5;
    std::
    vector<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
    ::emplace_back<std::unique_ptr<std::thread,std::default_delete<std::thread>>>
              ((vector<std::unique_ptr<std::thread,std::default_delete<std::thread>>,std::allocator<std::unique_ptr<std::thread,std::default_delete<std::thread>>>>
                *)&this[1].delegate,
               (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_13b8.field_0);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_13b8.field_0);
    numLanes = *(int *)((long)&this[1]._vptr_ExecutionQueue + 4);
  }
  return this;
}

Assistant:

ExecutionQueue* llbuild::basic::createLaneBasedExecutionQueue(
    ExecutionQueueDelegate& delegate, int numLanes, SchedulerAlgorithm alg,
    QualityOfService qos, const char* const* environment
) {
  if (!environment) {
    environment = const_cast<const char* const*>(environ);
  }
  return new LaneBasedExecutionQueue(delegate, numLanes, alg, qos, environment);
}